

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall ftxui::ContainerBase::MoveSelectorWrap(ContainerBase *this,int dir)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  size_type sVar4;
  __shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar5;
  ulong uStack_20;
  int i;
  size_t offset;
  int dir_local;
  ContainerBase *this_local;
  
  uStack_20 = 1;
  while( true ) {
    sVar3 = std::
            vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            ::size(&(this->super_ComponentBase).children_);
    if (sVar3 <= uStack_20) {
      return;
    }
    iVar1 = *this->selector_;
    sVar3 = std::
            vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            ::size(&(this->super_ComponentBase).children_);
    sVar4 = std::
            vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            ::size(&(this->super_ComponentBase).children_);
    iVar1 = (int)(((long)iVar1 + uStack_20 * (long)dir + sVar3) % sVar4);
    this_00 = (__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )std::
               vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ::operator[](&(this->super_ComponentBase).children_,(long)iVar1);
    peVar5 = std::
             __shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    uVar2 = (*peVar5->_vptr_ComponentBase[5])();
    if ((uVar2 & 1) != 0) break;
    uStack_20 = uStack_20 + 1;
  }
  *this->selector_ = iVar1;
  return;
}

Assistant:

void MoveSelectorWrap(int dir) {
    for (size_t offset = 1; offset < children_.size(); ++offset) {
      int i = (*selector_ + offset * dir + children_.size()) % children_.size();
      if (children_[i]->Focusable()) {
        *selector_ = i;
        return;
      }
    }
  }